

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O3

int mbedtls_ecdh_get_params
              (mbedtls_ecdh_context *ctx,mbedtls_ecp_keypair *key,mbedtls_ecdh_side side)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_group_copy(&ctx->grp,&key->grp);
  if (iVar1 == 0) {
    if (side == MBEDTLS_ECDH_OURS) {
      iVar1 = mbedtls_ecp_copy(&ctx->Q,&key->Q);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_copy(&ctx->d,&key->d);
        return iVar1;
      }
    }
    else {
      iVar1 = -0x4f80;
      if (side == MBEDTLS_ECDH_THEIRS) {
        iVar1 = mbedtls_ecp_copy(&ctx->Qp,&key->Q);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdh_get_params( mbedtls_ecdh_context *ctx, const mbedtls_ecp_keypair *key,
                     mbedtls_ecdh_side side )
{
    int ret;

    if( ( ret = mbedtls_ecp_group_copy( &ctx->grp, &key->grp ) ) != 0 )
        return( ret );

    /* If it's not our key, just import the public part as Qp */
    if( side == MBEDTLS_ECDH_THEIRS )
        return( mbedtls_ecp_copy( &ctx->Qp, &key->Q ) );

    /* Our key: import public (as Q) and private parts */
    if( side != MBEDTLS_ECDH_OURS )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_copy( &ctx->Q, &key->Q ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &ctx->d, &key->d ) ) != 0 )
        return( ret );

    return( 0 );
}